

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqcompiler.cpp
# Opt level: O0

void __thiscall
SQCompiler::EmitCompoundArith(SQCompiler *this,SQInteger tok,SQInteger etype,SQInteger pos)

{
  SQFuncState *pSVar1;
  SQOpcode SVar2;
  ulong uVar3;
  SQInteger arg0;
  SQInteger arg3;
  SQInteger SVar4;
  SQInteger SVar5;
  SQInteger tmp;
  SQInteger val_1;
  SQInteger src;
  SQInteger key;
  SQInteger val;
  SQInteger p1;
  SQInteger p2;
  SQInteger pos_local;
  SQInteger etype_local;
  SQInteger tok_local;
  SQCompiler *this_local;
  
  if (etype - 2U < 2) {
    uVar3 = SQFuncState::PopTarget(this->_fs);
    SVar4 = SQFuncState::PopTarget(this->_fs);
    SVar5 = SQFuncState::PopTarget(this->_fs);
    pSVar1 = this->_fs;
    arg0 = SQFuncState::PushTarget(this->_fs,-1);
    arg3 = ChooseCompArithCharByToken(this,tok);
    SQFuncState::AddInstruction(pSVar1,_OP_COMPARITH,arg0,SVar5 << 0x10 | uVar3,SVar4,arg3);
  }
  else if (etype == 4) {
    SVar4 = SQFuncState::PopTarget(this->_fs);
    SVar5 = SQFuncState::PopTarget(this->_fs);
    SQFuncState::PushTarget(this->_fs,SVar5);
    pSVar1 = this->_fs;
    SVar2 = ChooseArithOpByToken(this,tok);
    SQFuncState::AddInstruction(pSVar1,SVar2,SVar5,SVar4,SVar5,0);
    SQFuncState::SnoozeOpt(this->_fs);
  }
  else if (etype == 5) {
    SVar4 = SQFuncState::TopTarget(this->_fs);
    SVar5 = SQFuncState::PushTarget(this->_fs,-1);
    SQFuncState::AddInstruction(this->_fs,_OP_GETOUTER,SVar5,pos,0,0);
    pSVar1 = this->_fs;
    SVar2 = ChooseArithOpByToken(this,tok);
    SQFuncState::AddInstruction(pSVar1,SVar2,SVar5,SVar4,SVar5,0);
    SQFuncState::PopTarget(this->_fs);
    SQFuncState::PopTarget(this->_fs);
    pSVar1 = this->_fs;
    SVar4 = SQFuncState::PushTarget(this->_fs,-1);
    SQFuncState::AddInstruction(pSVar1,_OP_SETOUTER,SVar4,pos,SVar5,0);
  }
  return;
}

Assistant:

void EmitCompoundArith(SQInteger tok, SQInteger etype, SQInteger pos)
    {
        /* Generate code depending on the expression type */
        switch(etype) {
        case LOCAL:{
            SQInteger p2 = _fs->PopTarget(); //src in OP_GET
            SQInteger p1 = _fs->PopTarget(); //key in OP_GET
            _fs->PushTarget(p1);
            //EmitCompArithLocal(tok, p1, p1, p2);
            _fs->AddInstruction(ChooseArithOpByToken(tok),p1, p2, p1, 0);
            _fs->SnoozeOpt();
                   }
            break;
        case OBJECT:
        case BASE:
            {
                SQInteger val = _fs->PopTarget();
                SQInteger key = _fs->PopTarget();
                SQInteger src = _fs->PopTarget();
                /* _OP_COMPARITH mixes dest obj and source val in the arg1 */
                _fs->AddInstruction(_OP_COMPARITH, _fs->PushTarget(), (src<<16)|val, key, ChooseCompArithCharByToken(tok));
            }
            break;
        case OUTER:
            {
                SQInteger val = _fs->TopTarget();
                SQInteger tmp = _fs->PushTarget();
                _fs->AddInstruction(_OP_GETOUTER,   tmp, pos);
                _fs->AddInstruction(ChooseArithOpByToken(tok), tmp, val, tmp, 0);
                _fs->PopTarget();
                _fs->PopTarget();
                _fs->AddInstruction(_OP_SETOUTER, _fs->PushTarget(), pos, tmp);
            }
            break;
        }
    }